

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int cfft1f_(int *n,int *inc,fft_complex_t *c__,int *lenc,double *wsave,int *lensav,double *work,
           int *lenwrk,int *ier)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  *ier = 0;
  iVar2 = *n;
  if ((iVar2 + -1) * *inc < *lenc) {
    iVar1 = *lensav;
    dVar3 = log((double)iVar2);
    if (iVar1 < (int)(dVar3 / 0.6931471805599453) + iVar2 * 2 + 4) {
      iVar2 = 2;
    }
    else {
      iVar2 = *n;
      if (iVar2 * 2 <= *lenwrk) goto LAB_0010cbe6;
      iVar2 = 3;
    }
  }
  else {
    iVar2 = 1;
  }
  *ier = iVar2;
  iVar2 = *n;
LAB_0010cbe6:
  if (iVar2 != 1) {
    c1fm1f_(n,inc,c__,work,wsave,wsave + (long)(iVar2 * 2 + 1) + -1,wsave + (long)(iVar2 * 2) + 1);
  }
  return 0;
}

Assistant:

int cfft1f_(int *n, int *inc, complex *c__, int *
	lenc, fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk,
	int *ier)
{

    /* Local variables */
     int iw1;
    extern /* Subroutine */ int c1fm1f_(int *, int *, complex *, fft_real_t
	    *, fft_real_t *, fft_real_t *, fft_real_t *), xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --c__;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

    if (*lenc < *inc * (*n - 1) + 1) {
	*ier = 1;
	////xerfft_("CFFT1F ", &c__4, (ftnlen)7);
    } else if (*lensav < (*n << 1) + (int) (log((fft_real_t) (*n)) / log(2.0))
	    + 4) {
	*ier = 2;
	////xerfft_("CFFT1F ", &c__6, (ftnlen)7);
    } else if (*lenwrk < *n << 1) {
	*ier = 3;
	////xerfft_("CFFT1F ", &c__8, (ftnlen)7);
    }

    if (*n == 1) {
	return 0;
    }

    iw1 = *n + *n + 1;
    c1fm1f_(n, inc, &c__[1], &work[1], &wsave[1], &wsave[iw1], &wsave[iw1 + 1]
	    );
    return 0;
}